

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O2

void __thiscall
rangeless::fn::impl::
seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<rangeless::fn::get::second>::gen<rangeless::fn::impl::to_seq::gen<std::map<int,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>_>_>_>_>_>
::seq(seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<rangeless::fn::get::second>::gen<rangeless::fn::impl::to_seq::gen<std::map<int,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>_>_>_>_>_>
      *this,seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<rangeless::fn::get::second>::gen<rangeless::fn::impl::to_seq::gen<std::map<int,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>_>_>_>_>_>
            *param_1)

{
  bool bVar1;
  
  maybe<rangeless::fn::impl::X>::maybe(&this->m_current,&param_1->m_current);
  concat::
  gen<rangeless::fn::impl::transform<rangeless::fn::get::second>::gen<rangeless::fn::impl::to_seq::gen<std::map<int,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>_>_>_>_>
  ::gen(&this->m_gen,&param_1->m_gen);
  this->m_resumable = param_1->m_resumable;
  bVar1 = param_1->m_ended;
  this->m_started = param_1->m_started;
  this->m_ended = bVar1;
  return;
}

Assistant:

seq(seq&&) = default;